

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary.cc
# Opt level: O1

void __thiscall
ctemplate::TemplateDictionary::DictionaryPrinter::DumpVariables
          (DictionaryPrinter *this,VariableDict *dict)

{
  uint uVar1;
  _Rb_tree_node_base *p_Var2;
  mapped_type *this_00;
  _Rb_tree_node_base *p_Var3;
  long *plVar4;
  _Base_ptr p_Var5;
  long *plVar6;
  size_type *psVar7;
  _Rb_tree_node_base *p_Var8;
  bool bVar9;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  TemplateString key;
  string local_178;
  string local_158;
  string local_138;
  string local_118;
  _Rb_tree_node_base *local_f8;
  IndentedWriter *local_f0;
  anon_union_160_3_1f8f2db0_for_small_map<std::map<unsigned_long,_ctemplate::TemplateString,_std::less<unsigned_long>,_ctemplate::ArenaAllocator<std::pair<const_unsigned_long,_ctemplate::TemplateString>,_ctemplate::UnsafeArena>_>,_4,_std::equal_to<unsigned_long>,_ctemplate::TemplateDictionary::map_arena_init>_6
  *local_e8;
  string local_e0;
  string local_c0;
  string local_a0;
  key_type local_80;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sorted_variable_dict;
  
  sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header;
  sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  p_Var3 = (_Rb_tree_node_base *)0x0;
  sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8 = &dict->field_2;
  p_Var8 = (_Rb_tree_node_base *)local_e8;
  if (dict->size_ < 0) {
    p_Var3 = *(_Rb_tree_node_base **)((long)&dict->field_2 + 0x20);
    p_Var8 = (_Rb_tree_node_base *)0x0;
  }
  local_f8 = (_Rb_tree_node_base *)((long)&dict->field_2 + 0x10);
  local_f0 = &this->writer_;
  sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    uVar1 = dict->size_;
    if (p_Var8 == (_Rb_tree_node_base *)0x0) {
      p_Var2 = (_Rb_tree_node_base *)0x0;
      if ((int)uVar1 < 0) {
        p_Var2 = local_f8;
      }
      bVar9 = p_Var3 == p_Var2 && (int)uVar1 < 0;
    }
    else {
      p_Var2 = (_Rb_tree_node_base *)0x0;
      if (-1 < (int)uVar1) {
        p_Var2 = (_Rb_tree_node_base *)(local_e8->array_ + uVar1);
      }
      bVar9 = p_Var8 == p_Var2;
    }
    if (bVar9) break;
    p_Var2 = p_Var3 + 1;
    if (p_Var8 != (_Rb_tree_node_base *)0x0) {
      p_Var2 = p_Var8;
    }
    TemplateString::IdToString(&key,*(TemplateId *)p_Var2);
    if (key.ptr_ == (char *)0x0) {
      __assert_fail("!InvalidTemplateString(key)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_dictionary.cc"
                    ,0x314,
                    "void ctemplate::TemplateDictionary::DictionaryPrinter::DumpVariables(const VariableDict &)"
                   );
    }
    local_1b8[0] = local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,p_Var2->_M_parent,
               (long)&p_Var2->_M_parent->_M_color + (long)&p_Var2->_M_left->_M_color);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,key.ptr_,key.ptr_ + key.length_);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&sorted_variable_dict,&local_80);
    std::__cxx11::string::operator=((string *)this_00,(string *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p);
    }
    if (local_1b8[0] != local_1a8) {
      operator_delete(local_1b8[0]);
    }
    if (p_Var8 == (_Rb_tree_node_base *)0x0) {
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    }
    else {
      p_Var8 = (_Rb_tree_node_base *)&p_Var8[1]._M_parent;
    }
  }
  if ((_Rb_tree_header *)sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      != &sorted_variable_dict._M_t._M_impl.super__Rb_tree_header) {
    p_Var5 = sorted_variable_dict._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_1b8[0] = local_1a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_1b8,*(long *)(p_Var5 + 1),
                 (long)&(p_Var5[1]._M_parent)->_M_color + *(long *)(p_Var5 + 1));
      std::__cxx11::string::append((char *)local_1b8);
      plVar4 = (long *)std::__cxx11::string::_M_append((char *)local_1b8,*(ulong *)(p_Var5 + 2));
      key.ptr_ = &key.is_immutable_;
      plVar6 = plVar4 + 2;
      if ((long *)*plVar4 == plVar6) {
        key._16_8_ = *plVar6;
        key.id_ = plVar4[3];
      }
      else {
        key._16_8_ = *plVar6;
        key.ptr_ = (char *)*plVar4;
      }
      key.length_ = plVar4[1];
      *plVar4 = (long)plVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&key);
      psVar7 = (size_type *)(plVar4 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar4 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_e0.field_2._M_allocated_capacity = *psVar7;
        local_e0.field_2._8_8_ = plVar4[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar7;
        local_e0._M_dataplus._M_p = (pointer)*plVar4;
      }
      local_e0._M_string_length = plVar4[1];
      *plVar4 = (long)psVar7;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
      local_118._M_string_length = 0;
      local_118.field_2._M_local_buf[0] = '\0';
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      local_138._M_string_length = 0;
      local_138.field_2._M_local_buf[0] = '\0';
      local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
      local_158._M_string_length = 0;
      local_158.field_2._M_local_buf[0] = '\0';
      local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
      local_178._M_string_length = 0;
      local_178.field_2._M_local_buf[0] = '\0';
      local_a0._M_string_length = 0;
      local_a0.field_2._M_local_buf[0] = '\0';
      local_c0._M_string_length = 0;
      local_c0.field_2._M_local_buf[0] = '\0';
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      IndentedWriter::Write
                (local_f0,&local_e0,&local_118,&local_138,&local_158,&local_178,&local_a0,&local_c0)
      ;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178._M_dataplus._M_p != &local_178.field_2) {
        operator_delete(local_178._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p != &local_158.field_2) {
        operator_delete(local_158._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p);
      }
      if ((bool *)key.ptr_ != &key.is_immutable_) {
        operator_delete(key.ptr_);
      }
      if (local_1b8[0] != local_1a8) {
        operator_delete(local_1b8[0]);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &sorted_variable_dict._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&sorted_variable_dict._M_t);
  return;
}

Assistant:

void DumpVariables(const VariableDict& dict) {
    map<string, string> sorted_variable_dict;
    for (VariableDict::const_iterator it = dict.begin();
         it != dict.end();  ++it) {
      const TemplateString key = TemplateDictionary::IdToString(it->first);
      assert(!InvalidTemplateString(key));  // checks key.ptr_ != NULL
      sorted_variable_dict[PrintableTemplateString(key)] =
          PrintableTemplateString(it->second);
    }
    for (map<string,string>::const_iterator it = sorted_variable_dict.begin();
         it != sorted_variable_dict.end();  ++it) {
      writer_.Write(it->first + ": >" + it->second + "<\n");
    }
  }